

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_settings.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
libtorrent::aux::session_settings_single_thread::
get<std::__cxx11::string_const&,std::array<std::__cxx11::string,13ul>>
          (session_settings_single_thread *this,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
          *c,int name,int type)

{
  type *ptVar1;
  
  if (get<std::__cxx11::string_const&,std::array<std::__cxx11::string,13ul>>(std::array<std::__cxx11::string,13ul>const&,int,int)
      ::empty_abi_cxx11_ == '\0') {
    get<std::__cxx11::string_const&,std::array<std::__cxx11::string,13ul>>();
  }
  ptVar1 = &get<std::__cxx11::string_const&,std::array<std::__cxx11::string,13ul>>(std::array<std::__cxx11::string,13ul>const&,int,int)
            ::empty_abi_cxx11_;
  if ((name & 0xc000U) == type) {
    ptVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&c->_M_elems[0]._M_dataplus._M_p + (ulong)((name & 0x3fffU) << 5));
  }
  return ptVar1;
}

Assistant:

T get(Container const& c, int const name, int const type) const
		{
			static typename std::remove_reference<T>::type empty;
			TORRENT_ASSERT((name & settings_pack::type_mask) == type);
			if ((name & settings_pack::type_mask) != type) return empty;
			size_t const index = name & settings_pack::index_mask;
			TORRENT_ASSERT(index < c.size());
			return c[index];
		}